

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O1

void fasttext::averageRowsFast<32u>
               (Vector *x,vector<int,_std::allocator<int>_> *rows,DenseMatrix *matrix)

{
  float *pfVar1;
  int *piVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  int *piVar6;
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 in_ZMM0 [64];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 in_ZMM2 [64];
  
  auVar10 = in_ZMM0._0_16_;
  if (((ulong)(x->data_).mem_ & 0x3f) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(x.data()) % sizeof(Register) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.cc"
                  ,0xb3,
                  "void fasttext::averageRowsFast(Vector &, const std::vector<int32_t> &, const DenseMatrix &) [Cols = 32U]"
                 );
  }
  pfVar1 = (matrix->data_).mem_;
  if (((ulong)pfVar1 & 0x3f) == 0) {
    piVar2 = (rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    piVar3 = (rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    if (piVar2 != piVar3) {
      lVar4 = (matrix->super_Matrix).n_;
      lVar5 = *piVar2 * lVar4;
      auVar7 = *(undefined1 (*) [64])(pfVar1 + lVar5);
      auVar8 = *(undefined1 (*) [64])(pfVar1 + lVar5 + 0x10);
      piVar6 = piVar2;
      while (piVar6 = piVar6 + 1, piVar6 != piVar3) {
        lVar5 = *piVar6 * lVar4;
        auVar7 = vaddps_avx512f(auVar7,*(undefined1 (*) [64])(pfVar1 + lVar5));
        auVar8 = vaddps_avx512f(auVar8,*(undefined1 (*) [64])(pfVar1 + lVar5 + 0x10));
      }
      auVar10 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,(long)piVar3 - (long)piVar2 >> 2);
      auVar10._0_8_ = 1.0 / auVar10._0_8_;
      auVar10._8_8_ = 0x3ff0000000000000;
      auVar11._0_4_ = (float)auVar10._0_8_;
      auVar11._4_12_ = auVar10._4_12_;
      auVar9 = vbroadcastss_avx512f(auVar11);
      auVar7 = vmulps_avx512f(auVar9,auVar7);
      *(undefined1 (*) [64])(x->data_).mem_ = auVar7;
      auVar7 = vmulps_avx512f(auVar9,auVar8);
      *(undefined1 (*) [64])((x->data_).mem_ + 0x10) = auVar7;
      return;
    }
    Vector::zero(x);
    auVar10 = vcvtusi2sd_avx512f(auVar10,(long)(rows->super__Vector_base<int,_std::allocator<int>_>)
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(rows->super__Vector_base<int,_std::allocator<int>_>)
                                               ._M_impl.super__Vector_impl_data._M_start >> 2);
    Vector::mul(x,(float)(1.0 / auVar10._0_8_));
    return;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(matrix.data()) % sizeof(Register) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.cc"
                ,0xb4,
                "void fasttext::averageRowsFast(Vector &, const std::vector<int32_t> &, const DenseMatrix &) [Cols = 32U]"
               );
}

Assistant:

void averageRowsFast(Vector& x, const std::vector<int32_t>& rows, const DenseMatrix &matrix) {
  // Columns must be a multiple of how many floats fit in a register.
  static_assert(Cols % (sizeof(Register) / 4) == 0);
  constexpr unsigned RegisterCount = Cols / (sizeof(Register) / 4);
  // These should be aligned by aligned.h
  assert(reinterpret_cast<uintptr_t>(x.data()) % sizeof(Register) == 0);
  assert(reinterpret_cast<uintptr_t>(matrix.data()) % sizeof(Register) == 0);

  // Guard against empty list of rows with default NaN behavior.
  if (rows.empty()) {
    x.zero();
    x.mul(1.0 / rows.size());
    return;
  }

  // Copy the first row to accumulation registers.
  Register accum[RegisterCount];
  auto row = rows.cbegin();
  const Register *base = reinterpret_cast<const Register*>(matrix.data() + matrix.cols() * *row);
  for (unsigned i = 0; i < RegisterCount; ++i) {
    accum[i] = base[i];
  }
  // Add the rows after the first.
  for (++row; row != rows.cend(); ++row) {
    base = reinterpret_cast<const Register*>(matrix.data() + matrix.cols() * *row);
    for (unsigned i = 0; i < RegisterCount; ++i) {
      accum[i] = Add(accum[i], base[i]);
    }
  }
  // Multiply by (1.0 / rows.size()) and write to x.
  Register mul = Set1(1.0 / rows.size());
  for (unsigned i = 0; i < RegisterCount; ++i) {
    reinterpret_cast<Register*>(x.data())[i] = Multiply(accum[i], mul);
  }
}